

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmissionSystem::Encode(EmissionSystem *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pEVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  EmissionSystem *this_local;
  
  pKVar2 = KDataStream::operator<<(stream,this->m_ui8SystemDataLength);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumberOfBeams);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EmitterSystemRecord).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_Location).super_DataTypeBase);
  citrEnd = std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
            ::begin(&this->m_vEmitterBeams);
  local_28._M_current =
       (EmitterBeam *)
       std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::end
                 (&this->m_vEmitterBeams);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
             ::operator->(&citrEnd);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void EmissionSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui8SystemDataLength
           << m_ui8NumberOfBeams
           << m_ui16Padding
           << KDIS_STREAM m_EmitterSystemRecord
           << KDIS_STREAM m_Location;

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}